

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O3

uint32_t FastPForLib::Simple8b_Codec::tryRunLength(uint32_t *input,uint32_t pos,uint32_t count)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  uVar1 = input[pos];
  uVar4 = count + pos;
  uVar2 = pos;
  uVar6 = pos + 1;
  if (pos + 1 < uVar4) {
    uVar6 = uVar4;
  }
  do {
    uVar2 = uVar2 + 1;
    uVar3 = uVar6;
    if (uVar4 <= uVar2) break;
    uVar3 = uVar2;
  } while (uVar1 == input[uVar2]);
  uVar6 = uVar1 >> 0x10;
  if (0x7fff >= uVar1) {
    uVar6 = uVar1 | 1;
  }
  iVar7 = (uint)(0x7fff < uVar1) * 0x10;
  iVar5 = iVar7 + 8;
  uVar1 = uVar6 >> 8;
  if (uVar6 < 0x80) {
    iVar5 = iVar7;
    uVar1 = uVar6;
  }
  iVar7 = iVar5 + 4;
  uVar6 = uVar1 >> 4;
  if (uVar1 < 8) {
    iVar7 = iVar5;
    uVar6 = uVar1;
  }
  iVar5 = iVar7 + 2;
  uVar1 = uVar6 >> 2;
  if (uVar6 < 2) {
    iVar5 = iVar7;
    uVar1 = uVar6;
  }
  uVar2 = 0;
  if (0x3b < ((iVar5 + 1) - (uint)(uVar1 == 0)) * (uVar3 - pos)) {
    uVar2 = uVar3 - pos;
  }
  return uVar2;
}

Assistant:

static uint32_t tryRunLength(const uint32_t *input, uint32_t pos,
                               uint32_t count) {
    uint32_t startPos = pos;
    uint32_t endPos = pos + count;
    uint32_t test = input[pos++];
    if (test > RLE_MAX_VALUE_MASK)
      return 0;
    while (pos < endPos && test == input[pos]) {
      pos++;
    }
    uint32_t bitLen = bits(test | 1U);
    uint32_t repeatCount = (pos - startPos);
    return (bitLen * repeatCount >= SIMPLE8B_BITSIZE) ? repeatCount : 0;
  }